

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
          (ConfidentialTransactionContext *this,ConfidentialTransaction *transaction)

{
  ConfidentialTransaction *in_RDI;
  string local_30 [48];
  
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)in_RDI = &PTR__ConfidentialTransactionContext_0057e558;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x406963);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
         *)0x406971);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x406982);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x406993);
  return;
}

Assistant:

ConfidentialTransactionContext::ConfidentialTransactionContext(
    const ConfidentialTransaction& transaction)
    : ConfidentialTransaction(transaction.GetHex()) {}